

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlDOMWrapCtxtPtr_conflict xmlDOMWrapNewCtxt(void)

{
  xmlDOMWrapCtxtPtr_conflict pxVar1;
  
  pxVar1 = (xmlDOMWrapCtxtPtr_conflict)(*xmlMalloc)(0x20);
  if (pxVar1 != (xmlDOMWrapCtxtPtr_conflict)0x0) {
    pxVar1->namespaceMap = (void *)0x0;
    pxVar1->getNsForNodeFunc = (xmlDOMWrapAcquireNsFunction)0x0;
    pxVar1->_private = (void *)0x0;
    *(undefined8 *)&pxVar1->type = 0;
    return pxVar1;
  }
  __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"allocating DOM-wrapper context");
  return (xmlDOMWrapCtxtPtr_conflict)0x0;
}

Assistant:

xmlDOMWrapCtxtPtr
xmlDOMWrapNewCtxt(void)
{
    xmlDOMWrapCtxtPtr ret;

    ret = xmlMalloc(sizeof(xmlDOMWrapCtxt));
    if (ret == NULL) {
	xmlTreeErrMemory("allocating DOM-wrapper context");
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlDOMWrapCtxt));
    return (ret);
}